

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:102:36),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:102:36)>
  *__return_storage_ptr__;
  bool bVar1;
  TestConstType *t;
  Type *in_RCX;
  Type *in_R8;
  int local_2e8 [2];
  bool local_2dd;
  int local_2dc;
  int iStack_2d8;
  bool _kj_shouldLog_9;
  DebugExpression<int> local_2d4;
  undefined1 local_2d0 [8];
  DebugComparison<int,_int> _kjCondition_9;
  bool local_2a5;
  int local_2a4;
  int iStack_2a0;
  bool _kj_shouldLog_8;
  DebugExpression<int> local_29c;
  undefined1 local_298 [8];
  DebugComparison<int,_int> _kjCondition_8;
  bool local_26d;
  int local_26c;
  int iStack_268;
  bool _kj_shouldLog_7;
  DebugExpression<int> local_264;
  undefined1 local_260 [8];
  DebugComparison<int,_int> _kjCondition_7;
  BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:119:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:119:7)>
  local_238;
  ConstFunction<int_(int,_int)> local_230;
  int local_220 [2];
  bool local_215;
  int local_214;
  int iStack_210;
  bool _kj_shouldLog_6;
  DebugExpression<int> local_20c;
  undefined1 local_208 [8];
  DebugComparison<int,_int> _kjCondition_6;
  bool local_1dd;
  int local_1dc;
  int iStack_1d8;
  bool _kj_shouldLog_5;
  DebugExpression<int> local_1d4;
  undefined1 local_1d0 [8];
  DebugComparison<int,_int> _kjCondition_5;
  bool local_1a5;
  int local_1a4;
  int iStack_1a0;
  bool _kj_shouldLog_4;
  DebugExpression<int> local_19c;
  undefined1 local_198 [8];
  DebugComparison<int,_int> _kjCondition_4;
  BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:112:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:112:7)>
  local_170;
  ConstFunction<int_(int,_int)> local_168;
  int local_158;
  bool local_151;
  int local_150;
  DebugExpression<int> DStack_14c;
  bool _kj_shouldLog_3;
  undefined1 local_148 [8];
  DebugComparison<int,_int_&> _kjCondition_3;
  bool local_115;
  uint local_114;
  uint uStack_110;
  bool _kj_shouldLog_2;
  DebugExpression<unsigned_int> local_10c;
  undefined1 local_108 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_2;
  bool local_dd;
  int local_dc;
  int iStack_d8;
  bool _kj_shouldLog_1;
  DebugExpression<int> local_d4;
  undefined1 local_d0 [8];
  DebugComparison<int,_int> _kjCondition_1;
  bool local_a5;
  int local_a4;
  int iStack_a0;
  bool _kj_shouldLog;
  DebugExpression<int> local_9c;
  undefined1 local_98 [8];
  DebugComparison<int,_int> _kjCondition;
  BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:103:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:103:40)>
  local_70;
  undefined1 local_60 [8];
  ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> f2;
  undefined1 local_3a [2];
  BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:102:36),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:102:36)>
  local_38;
  undefined1 local_28 [8];
  ConstFunction<int_(int,_int)> f;
  TestConstType obj;
  TestCase100 *this_local;
  
  __return_storage_ptr__ =
       (BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:102:36),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:102:36)>
        *)((long)&f.impl.ptr + 4);
  TestConstType::TestConstType((TestConstType *)__return_storage_ptr__,0);
  local_38.t = (TestConstType *)
               kj::_::
               boundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__0,kj::(anonymous_namespace)::TestCase100::run()::__1>
                         (__return_storage_ptr__,(_ *)(local_3a + 1),(TestConstType *)local_3a,
                          (Type *)in_RCX,(Type *)in_R8);
  ConstFunction<int(int,int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__0,kj::(anonymous_namespace)::TestCase100::run()::__1>>
            ((ConstFunction<int(int,int)> *)local_28,&local_38);
  local_70.t = (TestConstType *)
               kj::_::
               boundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__2,kj::(anonymous_namespace)::TestCase100::run()::__3>
                         ((BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:103:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_function_test_c__:103:40)>
                           *)((long)&f.impl.ptr + 4),(_ *)&_kjCondition.field_0x1f,
                          (TestConstType *)&_kjCondition.field_0x1e,in_RCX,in_R8);
  ConstFunction<unsigned_int(unsigned_int,unsigned_int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__2,kj::(anonymous_namespace)::TestCase100::run()::__3>>
            ((ConstFunction<unsigned_int(unsigned_int,unsigned_int)> *)local_60,&local_70);
  iStack_a0 = 0x243;
  local_9c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff60);
  local_a4 = ConstFunction<int_(int,_int)>::operator()
                       ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_98,&local_9c,&local_a4)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar1) {
    local_a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_a5 != false) {
      _kjCondition_1._28_4_ = 0x243;
      _kjCondition_1._24_4_ =
           ConstFunction<int_(int,_int)>::operator()
                     ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x69,ERROR,
                 "\"failed: expected \" \"(123 + 456) == (f(123, 456))\", _kjCondition, 123 + 456, f(123, 456)"
                 ,(char (*) [46])"failed: expected (123 + 456) == (f(123, 456))",
                 (DebugComparison<int,_int> *)local_98,(int *)&_kjCondition_1.field_0x1c,
                 (int *)&_kjCondition_1.result);
      local_a5 = false;
    }
  }
  iStack_d8 = 0x10;
  local_d4 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff28);
  local_dc = ConstFunction<int_(int,_int)>::operator()
                       ((ConstFunction<int_(int,_int)> *)local_28,7,8);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_d0,&local_d4,&local_dc)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
  if (!bVar1) {
    local_dd = kj::_::Debug::shouldLog(ERROR);
    while (local_dd != false) {
      _kjCondition_2._28_4_ = 0x10;
      _kjCondition_2._24_4_ =
           ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,7,8);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 1) == (f(7, 8))\", _kjCondition, 7 + 8 + 1, f(7, 8)"
                 ,(char (*) [42])"failed: expected (7 + 8 + 1) == (f(7, 8))",
                 (DebugComparison<int,_int> *)local_d0,(int *)&_kjCondition_2.field_0x1c,
                 (int *)&_kjCondition_2.result);
      local_dd = false;
    }
  }
  uStack_110 = 0xd;
  local_10c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffef0);
  local_114 = ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::operator()
                        ((ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> *)local_60,2,9);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_108,&local_10c,&local_114);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_108);
  if (!bVar1) {
    local_115 = kj::_::Debug::shouldLog(ERROR);
    while (local_115 != false) {
      _kjCondition_3._36_4_ = 0xd;
      _kjCondition_3._32_4_ =
           ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::operator()
                     ((ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> *)local_60,2,9);
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"(9u + 2u + 2u) == (f2(2, 9))\", _kjCondition, 9u + 2u + 2u, f2(2, 9)"
                 ,(char (*) [46])"failed: expected (9u + 2u + 2u) == (f2(2, 9))",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_108,
                 (uint *)&_kjCondition_3.field_0x24,(uint *)&_kjCondition_3.result);
      local_115 = false;
    }
  }
  local_150 = 3;
  DStack_14c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_150);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_148,&stack0xfffffffffffffeb4,
             (int *)((long)&f.impl.ptr + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_148);
  if (!bVar1) {
    local_151 = kj::_::Debug::shouldLog(ERROR);
    while (local_151 != false) {
      local_158 = 3;
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"(3) == (obj.callCount)\", _kjCondition, 3, obj.callCount",
                 (char (*) [40])"failed: expected (3) == (obj.callCount)",
                 (DebugComparison<int,_int_&> *)local_148,&local_158,(int *)((long)&f.impl.ptr + 4))
      ;
      local_151 = false;
    }
  }
  TestConstType::TestConstType((TestConstType *)&_kjCondition_4.field_0x1c,10);
  kj::_::
  boundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__4,kj::(anonymous_namespace)::TestCase100::run()::__5>
            ((_ *)&local_170,(TestConstType *)&_kjCondition_4.field_0x1c,
             (Type *)&_kjCondition_4.field_0x1b,(Type *)&_kjCondition_4.field_0x1a);
  ConstFunction<int(int,int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__4,kj::(anonymous_namespace)::TestCase100::run()::__5>>
            ((ConstFunction<int(int,int)> *)&local_168,&local_170);
  ConstFunction<int_(int,_int)>::operator=((ConstFunction<int_(int,_int)> *)local_28,&local_168);
  ConstFunction<int_(int,_int)>::~ConstFunction(&local_168);
  kj::_::
  BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++:112:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++:112:7)>
  ::~BoundMethod(&local_170);
  TestConstType::~TestConstType((TestConstType *)&_kjCondition_4.field_0x1c);
  iStack_1a0 = 0x24d;
  local_19c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe60);
  local_1a4 = ConstFunction<int_(int,_int)>::operator()
                        ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_198,&local_19c,&local_1a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
  if (!bVar1) {
    local_1a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a5 != false) {
      _kjCondition_5._28_4_ = 0x24d;
      _kjCondition_5._24_4_ =
           ConstFunction<int_(int,_int)>::operator()
                     ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x72,ERROR,
                 "\"failed: expected \" \"(123 + 456 + 10) == (f(123, 456))\", _kjCondition, 123 + 456 + 10, f(123, 456)"
                 ,(char (*) [51])"failed: expected (123 + 456 + 10) == (f(123, 456))",
                 (DebugComparison<int,_int> *)local_198,(int *)&_kjCondition_5.field_0x1c,
                 (int *)&_kjCondition_5.result);
      local_1a5 = false;
    }
  }
  iStack_1d8 = 0x1a;
  local_1d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe28);
  local_1dc = ConstFunction<int_(int,_int)>::operator()
                        ((ConstFunction<int_(int,_int)> *)local_28,7,8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_1d0,&local_1d4,&local_1dc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
  if (!bVar1) {
    local_1dd = kj::_::Debug::shouldLog(ERROR);
    while (local_1dd != false) {
      _kjCondition_6._28_4_ = 0x1a;
      _kjCondition_6._24_4_ =
           ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,7,8);
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 11) == (f(7, 8))\", _kjCondition, 7 + 8 + 11, f(7, 8)"
                 ,(char (*) [43])"failed: expected (7 + 8 + 11) == (f(7, 8))",
                 (DebugComparison<int,_int> *)local_1d0,(int *)&_kjCondition_6.field_0x1c,
                 (int *)&_kjCondition_6.result);
      local_1dd = false;
    }
  }
  iStack_210 = 0x17;
  local_20c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffdf0);
  local_214 = ConstFunction<int_(int,_int)>::operator()
                        ((ConstFunction<int_(int,_int)> *)local_28,2,9);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_208,&local_20c,&local_214);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_208);
  if (!bVar1) {
    local_215 = kj::_::Debug::shouldLog(ERROR);
    while (local_215 != false) {
      local_220[1] = 0x17;
      local_220[0] = ConstFunction<int_(int,_int)>::operator()
                               ((ConstFunction<int_(int,_int)> *)local_28,2,9);
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x74,ERROR,
                 "\"failed: expected \" \"(9 + 2 + 12) == (f(2, 9))\", _kjCondition, 9 + 2 + 12, f(2, 9)"
                 ,(char (*) [43])"failed: expected (9 + 2 + 12) == (f(2, 9))",
                 (DebugComparison<int,_int> *)local_208,local_220 + 1,local_220);
      local_215 = false;
    }
  }
  t = mv<kj::(anonymous_namespace)::TestConstType>((TestConstType *)((long)&f.impl.ptr + 4));
  kj::_::
  boundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__6,kj::(anonymous_namespace)::TestCase100::run()::__7>
            ((_ *)&local_238,t,(Type *)&_kjCondition_7.field_0x1f,(Type *)&_kjCondition_7.field_0x1e
            );
  ConstFunction<int(int,int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__6,kj::(anonymous_namespace)::TestCase100::run()::__7>>
            ((ConstFunction<int(int,int)> *)&local_230,&local_238);
  ConstFunction<int_(int,_int)>::operator=((ConstFunction<int_(int,_int)> *)local_28,&local_230);
  ConstFunction<int_(int,_int)>::~ConstFunction(&local_230);
  kj::_::
  BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++:119:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++:119:7)>
  ::~BoundMethod(&local_238);
  f.impl.ptr._4_4_ = 0x4d2;
  iStack_268 = 0x246;
  local_264 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd98);
  local_26c = ConstFunction<int_(int,_int)>::operator()
                        ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_260,&local_264,&local_26c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_260);
  if (!bVar1) {
    local_26d = kj::_::Debug::shouldLog(ERROR);
    while (local_26d != false) {
      _kjCondition_8._28_4_ = 0x246;
      _kjCondition_8._24_4_ =
           ConstFunction<int_(int,_int)>::operator()
                     ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
      kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x7a,ERROR,
                 "\"failed: expected \" \"(123 + 456 + 3) == (f(123, 456))\", _kjCondition, 123 + 456 + 3, f(123, 456)"
                 ,(char (*) [50])"failed: expected (123 + 456 + 3) == (f(123, 456))",
                 (DebugComparison<int,_int> *)local_260,(int *)&_kjCondition_8.field_0x1c,
                 (int *)&_kjCondition_8.result);
      local_26d = false;
    }
  }
  iStack_2a0 = 0x13;
  local_29c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd60);
  local_2a4 = ConstFunction<int_(int,_int)>::operator()
                        ((ConstFunction<int_(int,_int)> *)local_28,7,8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_298,&local_29c,&local_2a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_298);
  if (!bVar1) {
    local_2a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a5 != false) {
      _kjCondition_9._28_4_ = 0x13;
      _kjCondition_9._24_4_ =
           ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,7,8);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x7b,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 4) == (f(7, 8))\", _kjCondition, 7 + 8 + 4, f(7, 8)"
                 ,(char (*) [42])"failed: expected (7 + 8 + 4) == (f(7, 8))",
                 (DebugComparison<int,_int> *)local_298,(int *)&_kjCondition_9.field_0x1c,
                 (int *)&_kjCondition_9.result);
      local_2a5 = false;
    }
  }
  iStack_2d8 = 0x10;
  local_2d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd28);
  local_2dc = ConstFunction<int_(int,_int)>::operator()
                        ((ConstFunction<int_(int,_int)> *)local_28,2,9);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_2d0,&local_2d4,&local_2dc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2d0);
  if (!bVar1) {
    local_2dd = kj::_::Debug::shouldLog(ERROR);
    while (local_2dd != false) {
      local_2e8[1] = 0x10;
      local_2e8[0] = ConstFunction<int_(int,_int)>::operator()
                               ((ConstFunction<int_(int,_int)> *)local_28,2,9);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x7c,ERROR,
                 "\"failed: expected \" \"(9 + 2 + 5) == (f(2, 9))\", _kjCondition, 9 + 2 + 5, f(2, 9)"
                 ,(char (*) [42])"failed: expected (9 + 2 + 5) == (f(2, 9))",
                 (DebugComparison<int,_int> *)local_2d0,local_2e8 + 1,local_2e8);
      local_2dd = false;
    }
  }
  ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::~ConstFunction
            ((ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> *)local_60);
  ConstFunction<int_(int,_int)>::~ConstFunction((ConstFunction<int_(int,_int)> *)local_28);
  TestConstType::~TestConstType((TestConstType *)((long)&f.impl.ptr + 4));
  return;
}

Assistant:

TEST(ConstFunction, Method) {
  TestConstType obj;
  ConstFunction<int(int, int)> f = KJ_BIND_METHOD(obj, foo);
  ConstFunction<uint(uint, uint)> f2 = KJ_BIND_METHOD(obj, foo);

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9u + 2u + 2u, f2(2, 9));

  EXPECT_EQ(3, obj.callCount);

  // Bind to a temporary.
  f = KJ_BIND_METHOD(TestConstType(10), foo);

  EXPECT_EQ(123 + 456 + 10, f(123, 456));
  EXPECT_EQ(7 + 8 + 11, f(7, 8));
  EXPECT_EQ(9 + 2 + 12, f(2, 9));

  // Bind to a move.
  f = KJ_BIND_METHOD(kj::mv(obj), foo);
  obj.callCount = 1234;

  EXPECT_EQ(123 + 456 + 3, f(123, 456));
  EXPECT_EQ(7 + 8 + 4, f(7, 8));
  EXPECT_EQ(9 + 2 + 5, f(2, 9));
}